

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wthelper.h
# Opt level: O2

bool __thiscall
WriterTestHelper<unsigned_char,_3U,_32849U>::compareRawImages
          (WriterTestHelper<unsigned_char,_3U,_32849U> *this,ktx_uint8_t *pData)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ktx_uint32_t kVar7;
  pointer pvVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ktx_uint8_t *pImage;
  void *__s1;
  uint *__s2;
  size_t __n;
  
  uVar2 = this->numLevels;
  uVar3 = this->numLayers;
  uVar4 = this->width;
  uVar5 = this->height;
  uVar6 = this->depth;
  kVar7 = this->numFaces;
  bVar1 = this->isArray;
  pvVar8 = (this->images).
           super__Vector_base<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (uVar17 = 0; uVar17 != uVar2; uVar17 = uVar17 + 1) {
    bVar13 = (byte)uVar17;
    uVar10 = uVar4 >> (bVar13 & 0x1f);
    __n = (ulong)uVar10 * 3;
    if (uVar10 == 0) {
      __n = 3;
    }
    uVar10 = uVar5 >> (bVar13 & 0x1f);
    uVar18 = (ulong)(uVar10 + (uVar10 == 0));
    uVar10 = uVar6 >> (bVar13 & 0x1f);
    uVar10 = uVar10 + (uVar10 == 0);
    uVar14 = (int)__n - 1U & 3;
    lVar19 = (uVar14 ^ 3) + __n;
    uVar21 = uVar18 * lVar19;
    if (kVar7 == 6) {
      uVar10 = 6;
    }
    uVar15 = (ulong)uVar10 * (ulong)uVar3 * uVar21;
    if (kVar7 == 6 && (bVar1 & 1U) == 0) {
      uVar15 = uVar21;
    }
    if (uVar15 != *(uint *)pData) break;
    pData = (ktx_uint8_t *)((long)pData + 4);
    uVar15 = (ulong)uVar10;
    if (kVar7 == 6 && (bVar1 & 1U) == 0) {
      uVar15 = 6;
    }
    for (uVar16 = 0; uVar16 != uVar3; uVar16 = uVar16 + 1) {
      lVar9 = *(long *)(*(long *)&pvVar8[uVar17].
                                  super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data + uVar16 * 0x18);
      for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
        __s1 = *(void **)(lVar9 + uVar12 * 0x18);
        uVar20 = uVar18;
        __s2 = (uint *)pData;
        if (uVar14 == 3) {
          iVar11 = bcmp(__s1,pData,*(long *)(uVar12 * 0x18 + lVar9 + 8) - (long)__s1);
          if (iVar11 != 0) goto LAB_0013a305;
        }
        else {
          while ((int)uVar20 != 0) {
            iVar11 = bcmp(__s1,__s2,__n);
            if (iVar11 != 0) goto LAB_0013a305;
            __s1 = (void *)((long)__s1 + __n);
            uVar20 = (ulong)((int)uVar20 - 1);
            __s2 = (uint *)((long)__s2 + lVar19);
          }
        }
        pData = (ktx_uint8_t *)((long)pData + uVar21);
      }
    }
  }
LAB_0013a305:
  return uVar2 <= uVar17;
}

Assistant:

bool compareRawImages(ktx_uint8_t* pData) {
        for (ktx_uint32_t level = 0; level < numLevels; level++) {
            ktx_uint32_t faceLodSize = *(ktx_uint32_t*)pData;
            ktx_uint32_t levelWidth = MAX(1, width >> level);
            ktx_uint32_t levelHeight = MAX(1, height >> level);
            ktx_uint32_t levelDepth = MAX(1, depth >> level);
            ktx_uint32_t numImages;
            ktx_uint32_t rowPadding;
            ktx_size_t paddedImageBytes;
            ktx_size_t paddedRowBytes, rowBytes;
            ktx_size_t expectedFaceLodSize;

            rowBytes = levelWidth
                            * sizeof(component_type)
                            * numComponents;
            rowPadding = 3 - ((rowBytes + KTX_GL_UNPACK_ALIGNMENT-1) % KTX_GL_UNPACK_ALIGNMENT);
            paddedRowBytes = rowBytes + rowPadding;
            paddedImageBytes = paddedRowBytes * levelHeight;
            if (numFaces == 6 && !isArray) {
                // Non-array cubemap.
                numImages = numFaces;
                expectedFaceLodSize = paddedImageBytes;
            } else {
                numImages = numFaces == 6 ? numFaces : levelDepth;
                expectedFaceLodSize = paddedImageBytes * numImages * numLayers;
            }
            if (faceLodSize != expectedFaceLodSize)
               return false;
            pData += sizeof(ktx_uint32_t);
            for (ktx_uint32_t layer = 0; layer < numLayers; layer++) {
                for (ktx_uint32_t faceSlice = 0; faceSlice < numImages; faceSlice++) {
                    if (rowPadding == 0) {
                        if (memcmp(images[level][layer][faceSlice].data(),
                                   pData,
                                   images[level][layer][faceSlice].size() * sizeof(component_type)))
                            return false;
                        pData += paddedImageBytes;
                    } else {
                        ktx_uint8_t* pImage = (ktx_uint8_t*)images[level][layer][faceSlice].data();
                        for (ktx_uint32_t row = 0; row < levelHeight; row++) {
                            if (memcmp(pImage, pData, rowBytes))
                                return false;
                            pImage += rowBytes;
                            pData += paddedRowBytes;
                        }
                    }
                }
            }
        }
        return true;
    }